

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderDuration
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  string *psVar1;
  undefined **ppuVar2;
  undefined1 error_message [16];
  bool bVar3;
  StringPiece *pSVar4;
  size_type n;
  stringpiece_ssize_type sVar5;
  AlphaNum *b;
  string *psVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  StringPiece SVar11;
  StringPiece SVar12;
  StringPiece error_message_00;
  StringPiece error_message_01;
  StringPiece error_message_02;
  StringPiece local_128;
  StringPiece local_118;
  StringPiece local_108;
  string local_f8;
  uint64 local_d8;
  uint64 unsigned_seconds;
  long local_c8;
  string local_c0;
  undefined1 local_a0 [16];
  anon_union_16_8_b72e7a25_for_DataPiece_3 local_90;
  bool local_80;
  ProtoStreamObjectWriter *local_70;
  undefined1 local_68 [8];
  Status nanos_status;
  uint local_38;
  int local_34;
  int32 i_nanos;
  
  nanos_status._0_8_ = local_68;
  if (data->type_ == TYPE_STRING) {
    local_f8._0_16_ = DataPiece::str(data);
    pcVar7 = local_f8._M_dataplus._M_p;
    psVar1 = &nanos_status.error_message_;
    local_68 = (undefined1  [8])psVar1;
    if (pcVar7 == (char *)0x0) {
      nanos_status._0_8_ = 0;
      nanos_status.error_message_._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,pcVar7,pcVar7 + local_f8._M_string_length);
    }
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"s","");
    if ((ulong)nanos_status._0_8_ < (ulong)local_a0._8_8_) {
      bVar3 = false;
    }
    else {
      iVar8 = std::__cxx11::string::compare
                        ((ulong)local_68,nanos_status._0_8_ - local_a0._8_8_,
                         (string *)local_a0._8_8_);
      bVar3 = iVar8 == 0;
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    if (local_68 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_68);
    }
    if (bVar3) {
      local_f8._0_16_ =
           StringPiece::substr((StringPiece *)&local_f8,0,local_f8._M_string_length - 1);
      unsigned_seconds = (uint64)__return_storage_ptr__;
      if ((local_f8._M_string_length < 1) || (*local_f8._M_dataplus._M_p != '-')) {
        local_34 = 1;
      }
      else {
        local_f8._0_16_ = StringPiece::substr((StringPiece *)&local_f8,1,0xffffffffffffffff);
        local_34 = -1;
      }
      local_70 = ow;
      _local_68 = (StringPiece)local_f8._0_16_;
      n = StringPiece::rfind((StringPiece *)local_68,'.',0xffffffffffffffff);
      local_c8 = -1;
      if (n == 0xffffffffffffffff) {
        SVar12 = (StringPiece)ZEXT816(0);
        SVar11 = _local_68;
      }
      else {
        SVar11 = StringPiece::substr((StringPiece *)local_68,0,n);
        SVar12 = StringPiece::substr((StringPiece *)local_68,n + 1,0xffffffffffffffff);
      }
      __return_storage_ptr__ = (Status *)unsigned_seconds;
      pcVar7 = SVar11.ptr_;
      local_68 = (undefined1  [8])&nanos_status.error_message_;
      if (pcVar7 == (char *)0x0) {
        nanos_status._0_8_ = 0;
        nanos_status.error_message_._M_dataplus._M_p._0_1_ = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,pcVar7,pcVar7 + SVar11.length_);
      }
      bVar3 = safe_strtou64((string *)local_68,&local_d8);
      if (local_68 != (undefined1  [8])&nanos_status.error_message_) {
        operator_delete((void *)local_68);
      }
      if (bVar3) {
        iVar8 = -2;
        local_c0._0_16_ = SVar12;
        do {
          SVar11.length_ = 1;
          SVar11.ptr_ = "0";
          bVar3 = StringPiece::Consume((StringPiece *)&local_c0,SVar11);
          iVar8 = iVar8 + 1;
        } while (bVar3);
        local_38 = 0;
        ppuVar2 = (undefined **)(local_a0 + 0x10);
        if (local_c0._M_string_length == 0) {
LAB_0031c8fb:
          iVar9 = 0;
          SVar12.length_ = 10;
          SVar12.ptr_ = "0123456789";
          sVar5 = StringPiece::find_first_not_of((StringPiece *)&local_c0,SVar12,0);
          if (sVar5 == local_c8) {
            if ((int)local_38 < 1) {
              iVar9 = 0;
            }
            else {
              if (8 < (uint)(iVar8 + (int)local_c0._M_string_length)) {
                StringPiece::StringPiece((StringPiece *)local_a0,"Duration value exceeds limits");
                psVar6 = (string *)local_a0._8_8_;
                pcVar7 = (char *)local_a0._0_8_;
                goto LAB_0031c9a5;
              }
              iVar9 = local_38 *
                      *(int *)(&DAT_00354db8 +
                              (ulong)(uint)(iVar8 + (int)local_c0._M_string_length) * 4);
            }
            Status::Status((Status *)local_68);
          }
          else {
            error_message_01.length_ = 0x35;
            error_message_01.ptr_ = "Invalid duration format, failed to parse nano seconds";
            Status::Status((Status *)local_68,INVALID_ARGUMENT,error_message_01);
          }
        }
        else {
          local_a0._0_8_ = ppuVar2;
          if (local_c0._M_dataplus._M_p == (char *)0x0) {
            local_a0._8_8_ = (string *)0x0;
            local_90.u64_ = local_90.u64_ & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a0,local_c0._M_dataplus._M_p,
                       local_c0._M_dataplus._M_p + local_c0._M_string_length);
          }
          bVar3 = safe_strto32((string *)local_a0,(int32 *)&local_38);
          if ((undefined **)local_a0._0_8_ != ppuVar2) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (bVar3) {
            if (local_38 < 0x3b9aca01) goto LAB_0031c8fb;
            pcVar7 = "Duration value exceeds limits";
            psVar6 = (string *)0x1d;
          }
          else {
            pcVar7 = "Invalid duration format, failed to parse nano seconds";
            psVar6 = (string *)0x35;
          }
LAB_0031c9a5:
          error_message_02.length_ = (stringpiece_ssize_type)psVar6;
          error_message_02.ptr_ = pcVar7;
          Status::Status((Status *)local_68,INVALID_ARGUMENT,error_message_02);
          iVar9 = 0;
        }
        if (local_68._0_4_ == OK) {
          lVar10 = (long)local_34;
          if ((lVar10 * local_d8 - 0x4979cb9e01 < 0xffffff6d0c68c3ff) ||
             (iVar9 = iVar9 * local_34, iVar9 + 0xc4653600U < 0x88ca6c01)) {
            StringPiece::StringPiece(&local_128,"Duration value exceeds limits");
            Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,local_128);
          }
          else {
            StringPiece::StringPiece(&local_118,"seconds");
            local_a0._0_8_ = &PTR__DataPiece_003bcd00;
            local_a0._8_4_ = TYPE_INT64;
            local_80 = false;
            local_90.i64_ = lVar10 * local_d8;
            ProtoWriter::RenderDataPiece
                      (&local_70->super_ProtoWriter,local_118,(DataPiece *)local_a0);
            StringPiece::StringPiece(&local_108,"nanos");
            local_a0._0_8_ = &PTR__DataPiece_003bcd00;
            local_a0._8_4_ = 1;
            local_90.i32_ = iVar9;
            local_80 = false;
            ProtoWriter::RenderDataPiece
                      (&local_70->super_ProtoWriter,local_108,(DataPiece *)local_a0);
            Status::Status(__return_storage_ptr__);
          }
        }
        else {
          Status::Status(__return_storage_ptr__,(Status *)local_68);
        }
        pSVar4 = (StringPiece *)&nanos_status.error_message_._M_string_length;
        goto LAB_0031c621;
      }
      pcVar7 = "Invalid duration format, failed to parse seconds";
      sVar5 = 0x30;
    }
    else {
      pcVar7 = "Illegal duration format; duration must end with \'s\'";
      sVar5 = 0x33;
    }
    error_message_00.length_ = sVar5;
    error_message_00.ptr_ = pcVar7;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message_00);
  }
  else {
    if (data->type_ == TYPE_NULL) {
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    nanos_status._0_8_ = 0x29;
    local_68 = (undefined1  [8])"Invalid data type for duration, value is ";
    b = (AlphaNum *)0x0;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_(&local_f8,data,(StringPiece)ZEXT816(0x346c7c));
    local_a0._0_8_ = local_f8._M_dataplus._M_p;
    local_a0._8_8_ = local_f8._M_string_length;
    StrCat_abi_cxx11_(&local_c0,(protobuf *)local_68,(AlphaNum *)local_a0,b);
    error_message = (undefined1  [16])local_c0._0_16_;
    if ((long)local_c0._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_c0._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,(StringPiece)error_message);
    if ((StringPiece *)local_c0._M_dataplus._M_p != (StringPiece *)&local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    pSVar4 = (StringPiece *)&local_f8.field_2;
LAB_0031c621:
    if ((StringPiece *)pSVar4[-1].ptr_ != pSVar4) {
      operator_delete((StringPiece *)pSVar4[-1].ptr_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderDuration(ProtoStreamObjectWriter* ow,
                                               const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for duration, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  StringPiece value(data.str());

  if (!HasSuffixString(value, "s")) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Illegal duration format; duration must end with 's'");
  }
  value = value.substr(0, value.size() - 1);
  int sign = 1;
  if (HasPrefixString(value, "-")) {
    sign = -1;
    value = value.substr(1);
  }

  StringPiece s_secs, s_nanos;
  SplitSecondsAndNanos(value, &s_secs, &s_nanos);
  uint64 unsigned_seconds;
  if (!safe_strtou64(s_secs, &unsigned_seconds)) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Invalid duration format, failed to parse seconds");
  }

  int32 nanos = 0;
  Status nanos_status = GetNanosFromStringPiece(
      s_nanos, "Invalid duration format, failed to parse nano seconds",
      "Duration value exceeds limits", &nanos);
  if (!nanos_status.ok()) {
    return nanos_status;
  }
  nanos = sign * nanos;

  int64 seconds = sign * unsigned_seconds;
  if (seconds > kDurationMaxSeconds || seconds < kDurationMinSeconds ||
      nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Duration value exceeds limits");
  }

  ow->ProtoWriter::RenderDataPiece("seconds", DataPiece(seconds));
  ow->ProtoWriter::RenderDataPiece("nanos", DataPiece(nanos));
  return Status();
}